

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O3

string * absl::lts_20240722::log_internal::MakeCheckOpString<char_const*,void_const*>
                   (char *v1,void *v2,char *exprtext)

{
  size_t sVar1;
  ostream *poVar2;
  string *psVar3;
  CheckOpMessageBuilder comb;
  CheckOpMessageBuilder local_190 [112];
  ios_base local_120 [264];
  
  absl::lts_20240722::log_internal::CheckOpMessageBuilder::CheckOpMessageBuilder(local_190,exprtext)
  ;
  if (v1 == (char *)0x0) {
    v1 = (char *)&kCharNull;
  }
  sVar1 = strlen(v1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,v1,sVar1);
  poVar2 = (ostream *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::ForVar2();
  absl::lts_20240722::log_internal::MakeCheckOpValueString(poVar2,v2);
  psVar3 = (string *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::NewString_abi_cxx11_()
  ;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return psVar3;
}

Assistant:

std::string* MakeCheckOpString(T1 v1, T2 v2, const char* exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}